

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O1

void __thiscall TTD::FileReader::ReadBytesInto_Fixed<long>(FileReader *this,long *data)

{
  byte *src;
  ulong sizeInBytes;
  size_t sVar1;
  ulong sizeInBytes_00;
  
  sVar1 = this->m_cursor;
  sizeInBytes_00 = this->m_buffCount - sVar1;
  if (sizeInBytes_00 < 8) {
    if (this->m_buffCount != sVar1) {
      js_memcpy_s(data,sizeInBytes_00,this->m_buffer + sVar1,sizeInBytes_00);
      this->m_cursor = this->m_cursor + sizeInBytes_00;
    }
    sVar1 = 8 - sizeInBytes_00;
    ReadBlock(this,this->m_buffer,&this->m_buffCount);
    this->m_cursor = 0;
    sizeInBytes = this->m_buffCount;
    if (sizeInBytes < sVar1) {
      TTDAbort_unrecoverable_error("Not sure what happened");
    }
    data = (long *)((long)data + sizeInBytes_00);
    src = this->m_buffer;
  }
  else {
    src = this->m_buffer + sVar1;
    sVar1 = 8;
    sizeInBytes = sizeInBytes_00;
  }
  js_memcpy_s(data,sizeInBytes,src,sVar1);
  this->m_cursor = this->m_cursor + sVar1;
  return;
}

Assistant:

void ReadBytesInto_Fixed(T& data)
        {
            size_t sizeAvailable = (this->m_buffCount - this->m_cursor);
            byte* buff = (byte*)&data;

            if(sizeAvailable >= sizeof(T))
            {
                js_memcpy_s(buff, sizeAvailable, this->m_buffer + this->m_cursor, sizeof(T));
                this->m_cursor += sizeof(T);
            }
            else
            {
                if(sizeAvailable > 0)
                {
                    js_memcpy_s(buff, sizeAvailable, this->m_buffer + this->m_cursor, sizeAvailable);
                    this->m_cursor += sizeAvailable;
                }

                byte* remainingBuff = (buff + sizeAvailable);
                size_t remainingBytes = (sizeof(T) - sizeAvailable);

                if(remainingBytes > 0)
                {
                    this->ReadBlock(this->m_buffer, &this->m_buffCount);
                    this->m_cursor = 0;

                    TTDAssert(this->m_buffCount >= remainingBytes, "Not sure what happened");
                    js_memcpy_s(remainingBuff, this->m_buffCount, this->m_buffer, remainingBytes);
                    this->m_cursor += remainingBytes;
                }
            }
        }